

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  int iVar3;
  undefined8 in_RAX;
  JSValueUnion JVar4;
  uint uVar5;
  ulong uVar7;
  JSValueUnion JVar8;
  void *pvVar9;
  ulong idx;
  JSRefCountHeader *p;
  int64_t iVar10;
  JSValue v;
  JSValue v_00;
  JSValue enum_obj;
  JSValue func_obj;
  JSValue enum_obj_00;
  JSValue this_obj;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue method;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue val;
  ulong in_stack_fffffffffffffef8;
  JSValue *argv_00;
  undefined4 uVar16;
  JSValueUnion *argv_01;
  BOOL *in_stack_ffffffffffffff00;
  int64_t local_f8;
  int64_t local_e8;
  JSValueUnion local_e0;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_88;
  int64_t len;
  JSValueUnion local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  ulong local_38;
  int64_t iVar6;
  
  JVar8 = (JSValueUnion)(argv->u).ptr;
  iVar6 = argv->tag;
  JVar14 = *argv;
  JVar12 = *argv;
  JVar11 = *argv;
  local_58.float64 = local_58.float64 & 0xffffffff00000000;
  local_48.int32 = 0;
  local_40 = 3;
  iVar10 = 3;
  local_98 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (argc < 2) {
    local_b0 = 0;
    local_b8 = 0;
    local_a0 = 3;
    pvVar9 = (void *)0x0;
    local_88 = local_98;
  }
  else {
    pvVar9 = argv[1].u.ptr;
    uVar7 = argv[1].tag;
    local_88 = (ulong)pvVar9 >> 0x20;
    local_a0 = uVar7;
    if ((int)uVar7 != 3) {
      iVar3 = check_function(ctx,argv[1]);
      if (iVar3 != 0) {
        local_e8 = 3;
        local_f8 = 3;
        JVar12 = (JSValue)(ZEXT816(3) << 0x40);
        JVar11 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_00155cd7;
      }
      if (argc != 2) {
        iVar10 = argv[2].tag;
        local_b8 = (ulong)argv[2].u.ptr & 0xffffffff00000000;
        local_b0 = (ulong)argv[2].u.ptr & 0xffffffff;
        local_98 = 0;
        goto LAB_00155a85;
      }
      local_98 = 0;
    }
    iVar10 = 3;
    local_b0 = 0;
    local_b8 = 0;
  }
LAB_00155a85:
  argv_00 = (JSValue *)(in_stack_fffffffffffffef8 & 0xffffffff00000000);
  JVar11 = JS_GetPropertyInternal(ctx,JVar11,0xc6,JVar12,0);
  uVar7 = 7;
  if ((int)JVar11.tag == 3) {
    JVar12 = JS_ToObject(ctx,JVar14);
    iVar6 = JVar12.tag;
    if (((int)JVar12.tag != 6) && (iVar3 = js_get_length64(ctx,&len,JVar12), -1 < iVar3)) {
      local_c0 = CONCAT44(len._4_4_,(uint)len);
      local_38 = 0;
      JVar8._4_4_ = 0;
      JVar8.int32 = (uint)len;
      if ((long)(int)(uint)len != local_c0) {
        local_38 = uVar7;
        JVar8.float64 = (double)(long)local_c0;
      }
      local_70 = local_38;
      local_78.float64 = JVar8.float64;
      if (((int)this_val.tag == -1) && ((*(byte *)((long)this_val.u.ptr + 5) & 0x10) != 0)) {
        JVar11 = JS_CallConstructor(ctx,this_val,1,(JSValue *)&local_78);
      }
      else {
        JVar11 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_78);
      }
      uVar7 = (ulong)JVar11.u.ptr >> 0x20;
      JVar14.tag = local_38;
      JVar14.u.float64 = JVar8.float64;
      JS_FreeValue(ctx,JVar14);
      if ((int)JVar11.tag == 6) {
LAB_00156131:
        local_e8 = 3;
        local_f8 = 3;
      }
      else {
        idx = 0;
        if ((long)local_c0 < 1) {
          local_c0 = idx;
        }
        do {
          local_e8 = 3;
          if (local_c0 == idx) {
            local_f8 = 3;
            goto LAB_001560ce;
          }
          JVar14 = JS_GetPropertyInt64(ctx,JVar12,idx);
          if ((int)JVar14.tag == 6) goto LAB_00156131;
          JVar15 = JVar14;
          if ((char)local_98 == '\0') {
            local_68 = idx & 0xffffffff;
            local_60 = 0;
            JVar15.tag = local_a0;
            JVar15.u.ptr = (void *)((ulong)pvVar9 & 0xffffffff | local_88 << 0x20);
            this_obj_01.tag = iVar10;
            this_obj_01.u.ptr = (void *)(local_b8 | local_b0);
            _local_78 = JVar14;
            JVar15 = JS_Call(ctx,JVar15,this_obj_01,2,(JSValue *)&local_78);
            JS_FreeValue(ctx,JVar14);
            if ((int)JVar15.tag == 6) {
              local_f8 = 3;
              goto LAB_00155cd7;
            }
          }
          iVar3 = JS_DefinePropertyValueInt64(ctx,JVar11,idx,JVar15,0x4007);
          idx = idx + 1;
        } while (-1 < iVar3);
        local_f8 = 3;
      }
      goto LAB_00155cd7;
    }
  }
  else {
    if ((int)JVar11.tag != 6) {
      JS_FreeValue(ctx,JVar11);
      if (((int)this_val.tag == -1) && ((*(byte *)((long)this_val.u.ptr + 5) & 0x10) != 0)) {
        JVar11 = JS_CallConstructor(ctx,this_val,0,(JSValue *)0x0);
      }
      else {
        JVar11 = JS_NewArray(ctx);
      }
      uVar7 = (ulong)JVar11.u.ptr >> 0x20;
      if ((int)JVar11.tag == 6) {
        local_e8 = 3;
        local_f8 = 3;
      }
      else {
        if (0xfffffff4 < (uint)iVar6) {
          *(int *)JVar8.ptr = *JVar8.ptr + 1;
        }
        local_58 = JVar8;
        local_50 = iVar6;
        iVar3 = js_for_of_start(ctx,(JSValue *)&local_48,0);
        iVar2 = local_40;
        iVar6 = local_50;
        JVar8 = local_58;
        local_e8 = local_40;
        local_f8 = local_50;
        if (iVar3 == 0) {
          method.u._4_4_ = local_48._4_4_;
          method.u.int32 = local_48.int32;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_58;
          JVar12 = (JSValue)(auVar1 << 0x40);
          local_c0 = 0;
LAB_00155d96:
          enum_obj.tag = iVar6;
          enum_obj.u.ptr = JVar8.ptr;
          method.tag = iVar2;
          JVar14 = JS_IteratorNext(ctx,enum_obj,method,(int)&len,argv_00,in_stack_ffffffffffffff00);
          uVar16 = (undefined4)((ulong)argv_00 >> 0x20);
          if ((int)JVar14.tag != 6) {
            if ((uint)len != 0) {
              iVar6 = 3;
LAB_001560ce:
              local_e0 = JVar12.u;
              JVar12.tag = iVar6;
              JVar12.u.float64 = local_e0.float64;
              uVar5 = (uint)local_c0;
              JVar4._0_4_ = uVar5 & 0x7fffffff;
              JVar4._4_4_ = 0;
              JVar8.float64 = (double)(local_c0 & 0xffffffff);
              if (-1 < (int)uVar5) {
                JVar8 = JVar4;
              }
              iVar6 = 7;
              if (-1 < (int)uVar5) {
                iVar6 = 0;
              }
              this_obj.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar7 << 0x20);
              this_obj.tag = JVar11.tag;
              val.tag = iVar6;
              val.u.float64 = JVar8.float64;
              iVar3 = JS_SetProperty(ctx,this_obj,0x30,val);
              if (-1 < iVar3) goto LAB_00155cf0;
              goto LAB_00155cd7;
            }
            JVar15 = JVar14;
            if ((char)local_98 == '\0') {
              local_68 = local_c0 & 0xffffffff;
              local_60 = 0;
              argv_01 = &local_78;
              func_obj.tag = local_a0;
              func_obj.u.ptr = (void *)((ulong)pvVar9 & 0xffffffff | local_88 << 0x20);
              this_obj_00.tag = iVar10;
              this_obj_00.u.ptr = (void *)(local_b8 | local_b0);
              _local_78 = JVar14;
              JVar15 = JS_Call(ctx,func_obj,this_obj_00,2,(JSValue *)argv_01);
              uVar16 = (undefined4)((ulong)argv_01 >> 0x20);
              JS_FreeValue(ctx,JVar14);
              if ((int)JVar15.tag == 6) goto LAB_00155ebd;
            }
            argv_00 = (JSValue *)CONCAT44(uVar16,0x4007);
            iVar3 = JS_DefinePropertyValueInt64(ctx,JVar11,local_c0,JVar15,0x4007);
            if (-1 < iVar3) goto code_r0x00155e7a;
          }
LAB_00155ebd:
          if ((int)iVar6 != 3) {
            enum_obj_00.tag = iVar6;
            enum_obj_00.u.ptr = JVar8.ptr;
            JS_IteratorClose(ctx,enum_obj_00,1);
          }
        }
      }
      JVar12 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00155cd7;
    }
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
  }
  local_e8 = 3;
  local_f8 = 3;
  JVar11 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00155cd7:
  uVar7 = uVar7 << 0x20;
  JVar11.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar7);
  JS_FreeValue(ctx,JVar11);
  JVar11 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00155cf0:
  JS_FreeValue(ctx,JVar12);
  v.tag = local_f8;
  v.u.float64 = local_58.float64;
  JS_FreeValue(ctx,v);
  v_00.u._4_4_ = local_48._4_4_;
  v_00.u.int32 = local_48.int32;
  v_00.tag = local_e8;
  JS_FreeValue(ctx,v_00);
  JVar13.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar7 << 0x20);
  JVar13.tag = JVar11.tag;
  return JVar13;
code_r0x00155e7a:
  local_c0 = local_c0 + 1;
  goto LAB_00155d96;
}

Assistant:

static JSValue js_array_from(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, r, v, v2, arrayLike;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arrayLike = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        if (JS_IsConstructor(ctx, this_val))
            r = JS_CallConstructor(ctx, this_val, 0, NULL);
        else
            r = JS_NewArray(ctx);
        if (JS_IsException(r))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception_close;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arrayLike = JS_ToObject(ctx, items);
        if (JS_IsException(arrayLike))
            goto exception;
        if (js_get_length64(ctx, &len, arrayLike) < 0)
            goto exception;
        v = JS_NewInt64(ctx, len);
        args[0] = v;
        if (JS_IsConstructor(ctx, this_val)) {
            r = JS_CallConstructor(ctx, this_val, 1, args);
        } else {
            r = js_array_constructor(ctx, JS_UNDEFINED, 1, args);
        }
        JS_FreeValue(ctx, v);
        if (JS_IsException(r))
            goto exception;
        for(k = 0; k < len; k++) {
            v = JS_GetPropertyInt64(ctx, arrayLike, k);
            if (JS_IsException(v))
                goto exception;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, r, JS_ATOM_length, JS_NewUint32(ctx, k)) < 0)
        goto exception;
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arrayLike);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}